

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O3

void __thiscall adios2::query::Worker::~Worker(Worker *this)

{
  pointer pcVar1;
  
  this->_vptr_Worker = (_func_int **)&PTR__Worker_008733e8;
  if (this->m_Query != (QueryBase *)0x0) {
    (*this->m_Query->_vptr_QueryBase[1])();
  }
  pcVar1 = (this->m_QueryFile)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_QueryFile).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Worker::~Worker()
{
    if (m_Query != nullptr)
        delete m_Query;
}